

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O3

void printOptionExportValues(TidyDoc tdoc,TidyOption topt,OptionDesc *d)

{
  uint uVar1;
  TidyOptionId optId;
  TidyConfigCategory TVar2;
  ctmbstr ptVar3;
  size_t sVar4;
  ulong uVar5;
  char *in;
  TidyBuffer *buf;
  TidyIterator pos;
  TidyBuffer buf2;
  TidyBuffer buf1;
  TidyIterator local_78;
  TidyBuffer local_70;
  TidyBuffer local_50;
  
  optId = tidyOptGetId(topt);
  TVar2 = tidyOptGetCategory(topt);
  if (TVar2 == TidyInternalCategory) {
    return;
  }
  uVar1 = optId - TidyBlockTags;
  if (uVar1 < 0x3e) {
    if ((0x1000000400010001U >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
      if (((ulong)uVar1 != 0x3d) ||
         (local_70.allocator = (TidyAllocator *)tidyOptGetPriorityAttrList(tdoc),
         (undefined1 *)((long)&(local_70.allocator)->vtbl + 1) < (undefined1 *)0x2))
      goto LAB_00133268;
      tidyBufInit(&local_50);
      do {
        ptVar3 = tidyOptGetNextPriorityAttr(tdoc,(TidyIterator *)&local_70);
        d->def = ptVar3;
        if (ptVar3 != (ctmbstr)0x0) {
          if (local_50.size != 0) {
            tidyBufAppend(&local_50," ",1);
            ptVar3 = d->def;
          }
          sVar4 = strlen(ptVar3);
          tidyBufAppend(&local_50,ptVar3,(uint)sVar4);
        }
      } while (local_70.allocator != (TidyAllocator *)0x0);
      buf = &local_50;
      tidyBufAppend(buf,"",1);
      printf("%s: %s\n",d->name,local_50.bp);
      d->name = "";
      d->type = "";
      d->def = (ctmbstr)0x0;
    }
    else {
      local_78 = tidyOptGetDeclTagList(tdoc);
      if (local_78 == (TidyIterator)0x0) goto LAB_00133268;
      tidyBufInit(&local_50);
      tidyBufInit(&local_70);
      do {
        ptVar3 = tidyOptGetNextDeclTag(tdoc,optId,&local_78);
        d->def = ptVar3;
        if (ptVar3 != (ctmbstr)0x0) {
          if (local_50.size != 0) {
            tidyBufAppend(&local_50," ",1);
            ptVar3 = d->def;
          }
          sVar4 = strlen(ptVar3);
          tidyBufAppend(&local_50,ptVar3,(uint)sVar4);
        }
      } while (local_78 != (TidyIterator)0x0);
      if (local_50.bp != (byte *)0x0) {
        uVar5 = (ulong)local_50.size;
        if (uVar5 != 0) {
          do {
            if (local_50.bp[uVar5 - 1] == ' ') {
              local_50.bp[uVar5 - 1] = '\0';
              if (local_70.size != 0) {
                tidyBufAppend(&local_70," ",1);
              }
              sVar4 = strlen((char *)(local_50.bp + uVar5));
              tidyBufAppend(&local_70,local_50.bp + uVar5,(uint)sVar4);
            }
            uVar5 = uVar5 - 1;
          } while (uVar5 != 0);
        }
        if (local_70.size != 0) {
          tidyBufAppend(&local_70," ",1);
        }
        sVar4 = strlen((char *)local_50.bp);
        tidyBufAppend(&local_70,local_50.bp,(uint)sVar4);
      }
      buf = &local_70;
      tidyBufAppend(buf,"",1);
      printf("%s: %s\n",d->name,local_70.bp);
      d->name = "";
      d->type = "";
      d->def = (ctmbstr)0x0;
      tidyBufFree(&local_50);
    }
    tidyBufFree(buf);
  }
LAB_00133268:
  if (((*d->name != '\0') || (*d->type != '\0')) || ((d->def != (char *)0x0 && (*d->def != '\0'))))
  {
    if (d->def == (ctmbstr)0x0) {
      d->def = "";
    }
    printf("%s: %s\n");
  }
  return;
}

Assistant:

static void printOptionExportValues(TidyDoc ARG_UNUSED(tdoc),  /**< The Tidy document. */
                                    TidyOption topt,           /**< The option for which to show values. */
                                    OptionDesc *d              /**< The OptionDesc array. */
                                    )
{
    TidyOptionId optId = tidyOptGetId( topt );
    TidyBuffer buf1, buf2;

    if ( tidyOptGetCategory(topt) == TidyInternalCategory )
        return;

    switch ( optId )
    {
        case TidyInlineTags:
        case TidyBlockTags:
        case TidyEmptyTags:
        case TidyPreTags:
        {
            TidyIterator pos = tidyOptGetDeclTagList( tdoc );
            if ( pos )  /* Is #697 - one or more values */
            {
                tidyBufInit(&buf1);
                tidyBufInit(&buf2);
                while (pos)
                {
                    d->def = tidyOptGetNextDeclTag(tdoc, optId, &pos);
                    if (d->def)
                    {
                        if (buf1.size)
                            tidyBufAppend(&buf1, " ", 1);
                        tidyBufAppend(&buf1, (void *)d->def, strlen(d->def));
                    }
                }
                invertBuffer(&buf1, &buf2); /* Is #697 - specialised service to invert words */
                tidyBufAppend(&buf2, (void *)"\0", 1); /* is this really required? */
                printf("%s: %s\n", d->name, buf2.bp);
                d->name = "";
                d->type = "";
                d->def = 0;
                tidyBufFree(&buf1);
                tidyBufFree(&buf2);
            }
        }
            break;
        case TidyPriorityAttributes: /* Is #697 - This case seems missing */
        {
            TidyIterator itAttr = tidyOptGetPriorityAttrList(tdoc);
            if (itAttr && (itAttr != (TidyIterator)-1))
            {
                tidyBufInit(&buf1);
                while (itAttr)
                {
                    d->def = tidyOptGetNextPriorityAttr(tdoc, &itAttr);
                    if (d->def)
                    {
                        if (buf1.size)
                            tidyBufAppend(&buf1, " ", 1);
                        tidyBufAppend(&buf1, (void *)d->def, strlen(d->def));
                    }
                }
                tidyBufAppend(&buf1, (void *)"\0", 1); /* is this really required? */
                printf("%s: %s\n", d->name, buf1.bp);
                d->name = "";
                d->type = "";
                d->def = 0;
                tidyBufFree(&buf1);
            }
        }
        break;
        default:
            break;
    }

    /* fix for http://tidy.sf.net/bug/873921 */
    if ( *d->name || *d->type || (d->def && *d->def) )
    {
        if ( ! d->def )
            d->def = "";
        printf( "%s: %s\n", d->name, d->def );
    }
}